

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O1

void effect_simple(wchar_t index,source origin,char *dice_string,wchar_t subtype,wchar_t radius,
                  wchar_t other,wchar_t y,wchar_t x,_Bool *ident)

{
  effect *peVar1;
  _Bool *ident_00;
  source origin_00;
  _Bool dummy_ident;
  wchar_t dir;
  effect effect;
  
  origin_00.which = origin.which;
  dir = L'\x05';
  dummy_ident = false;
  effect.next = (effect *)0x0;
  effect.dice = (dice_t *)0x0;
  effect.y = L'\0';
  effect.x = L'\0';
  effect.subtype = L'\0';
  effect.radius = L'\0';
  effect.other = L'\0';
  effect._44_4_ = 0;
  effect.msg = (char *)0x0;
  effect._10_6_ = 0;
  effect.index = (ushort)index;
  effect.dice = dice_new();
  dice_parse_string(effect.dice,dice_string);
  effect.radius = radius;
  effect.subtype = subtype;
  effect.other = other;
  effect.x = x;
  effect.y = y;
  if ((ushort)(effect.index - 1) < 0x7f) {
    peVar1 = &effect;
    do {
      if (effects[peVar1->index].aim != false) {
        get_aim_dir(&dir);
        break;
      }
      peVar1 = peVar1->next;
    } while (peVar1 != (effect *)0x0);
  }
  ident_00 = &dummy_ident;
  if (ident != (_Bool *)0x0) {
    ident_00 = ident;
  }
  origin_00._0_8_ = origin._0_8_ & 0xffffffff;
  effect_do(&effect,origin_00,(object *)0x0,ident_00,true,dir,L'\0',L'\0',(command *)0x0);
  dice_free(effect.dice);
  return;
}

Assistant:

void effect_simple(int index,
				   struct source origin,
				   const char *dice_string,
				   int subtype,
				   int radius,
				   int other,
				   int y,
				   int x,
				   bool *ident)
{
	struct effect effect;
	int dir = DIR_TARGET;
	bool dummy_ident = false;

	/* Set all the values */
	memset(&effect, 0, sizeof(effect));
	effect.index = index;
	effect.dice = dice_new();
	dice_parse_string(effect.dice, dice_string);
	effect.subtype = subtype;
	effect.radius = radius;
	effect.other = other;
	effect.y = y;
	effect.x = x;

	/* Direction if needed */
	if (effect_aim(&effect))
		get_aim_dir(&dir);

	/* Do the effect */
	if (!ident) {
		ident = &dummy_ident;
	}

	effect_do(&effect, origin, NULL, ident, true, dir, 0, 0, NULL);
	dice_free(effect.dice);
}